

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRVersion.h
# Opt level: O2

int ZXing::QRCode::CharacterCountBits(CodecMode mode,Version *version)

{
  int iVar1;
  undefined *puVar2;
  long lVar3;
  int aiStack_24 [3];
  undefined8 local_18;
  undefined8 uStack_10;
  
  iVar1 = version->_versionNumber;
  if (version->_type == rMQR) {
    switch(mode) {
    case NUMERIC:
      puVar2 = &DAT_001a7060;
      break;
    case ALPHANUMERIC:
      puVar2 = &DAT_001a7080;
      break;
    default:
      goto switchD_0018abc8_caseD_3;
    case BYTE:
      puVar2 = &DAT_001a70a0;
      break;
    case KANJI:
      puVar2 = &DAT_001a70c0;
    }
    return (int)(char)puVar2[(long)iVar1 + -1];
  }
  if (version->_type == Micro) {
    switch(mode) {
    case NUMERIC:
      local_18 = 0x400000003;
      uStack_10 = 0x600000005;
      return aiStack_24[(long)iVar1 + 2];
    case ALPHANUMERIC:
      local_18 = 0x400000003;
      uStack_10 = CONCAT44(uStack_10._4_4_,5);
      return aiStack_24[(long)iVar1 + 1];
    case STRUCTURED_APPEND:
    case FNC1_FIRST_POSITION:
    case BYTE|ALPHANUMERIC:
    case ECI:
switchD_0018abc8_caseD_3:
      return 0;
    case BYTE:
      local_18 = 0x500000004;
      break;
    default:
      if (mode != HANZI) {
        return 0;
      }
    case KANJI:
      local_18 = 0x400000003;
    }
    return aiStack_24[iVar1];
  }
  lVar3 = 0;
  if (9 < iVar1) {
    lVar3 = (ulong)(0x1a < iVar1) + 1;
  }
  switch(mode) {
  case NUMERIC:
    local_18 = 0xc0000000a;
    uStack_10 = CONCAT44(uStack_10._4_4_,0xe);
    break;
  case ALPHANUMERIC:
    local_18 = 0xb00000009;
    uStack_10 = CONCAT44(uStack_10._4_4_,0xd);
    break;
  case STRUCTURED_APPEND:
  case FNC1_FIRST_POSITION:
  case BYTE|ALPHANUMERIC:
  case ECI:
    goto switchD_0018abc8_caseD_3;
  case BYTE:
    local_18 = 0x1000000008;
    uStack_10 = CONCAT44(uStack_10._4_4_,0x10);
    break;
  default:
    if (mode != HANZI) {
      return 0;
    }
  case KANJI:
    local_18 = 0xa00000008;
    uStack_10 = CONCAT44(uStack_10._4_4_,0xc);
  }
  return *(int *)((long)&local_18 + lVar3 * 4);
}

Assistant:

int versionNumber() const { return _versionNumber; }